

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_uniform
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint b;
  uint uVar5;
  uint b_00;
  byte in_DL;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *in_RSI;
  color_quad_u8 *in_RDI;
  uint e23;
  uint e01;
  uint count;
  unique_color *color;
  uint64 error;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined1 alpha;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffb3;
  uint local_44;
  unique_color *local_40;
  undefined8 in_stack_ffffffffffffffc8;
  ulong uVar6;
  byte local_23;
  byte local_1f;
  bool local_1;
  
  bVar1 = in_DL & 1;
  dxt1_block::unpack_color
            ((uint16)((ulong)in_stack_ffffffffffffffc8 >> 0x30),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x28,0),(uint)in_stack_ffffffffffffffc8);
  dxt1_block::unpack_color
            ((uint16)((ulong)in_stack_ffffffffffffffc8 >> 0x30),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x28,0),(uint)in_stack_ffffffffffffffc8);
  uVar2 = ((uint)local_1f * 2 + (uint)local_23 + (uint)bVar1) / 3;
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)CONCAT44(in_stack_ffffffffffffffa4,uVar2),
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0,0x1dc4d8);
  uVar3 = ((uint)local_23 * 2 + (uint)local_1f + (uint)bVar1) / 3;
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffff98,0,0x1dc557);
  uVar6 = 0;
  local_40 = vector<crnlib::unique_color>::get_ptr((vector<crnlib::unique_color> *)(in_RDI + 0x12));
  local_44 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 0x12));
  while (alpha = (undefined1)(in_stack_ffffffffffffff9c >> 0x18), local_44 != 0) {
    uVar4 = crnlib::color::color_distance
                      ((bool)in_stack_ffffffffffffffb3,in_RDI,(color_quad_u8 *)CONCAT44(uVar3,uVar2)
                       ,(bool)alpha);
    b = crnlib::color::color_distance
                  ((bool)in_stack_ffffffffffffffb3,in_RDI,(color_quad_u8 *)CONCAT44(uVar3,uVar2),
                   (bool)alpha);
    uVar5 = math::minimum<unsigned_int>(uVar4,b);
    in_stack_ffffffffffffff9c =
         crnlib::color::color_distance
                   ((bool)in_stack_ffffffffffffffb3,in_RDI,(color_quad_u8 *)CONCAT44(uVar3,uVar2),
                    (bool)alpha);
    uVar4 = crnlib::color::color_distance
                      ((bool)in_stack_ffffffffffffffb3,in_RDI,(color_quad_u8 *)CONCAT44(uVar3,uVar2)
                       ,SUB41(in_stack_ffffffffffffff9c >> 0x18,0));
    b_00 = math::minimum<unsigned_int>(in_stack_ffffffffffffff9c,uVar4);
    uVar5 = math::minimum<unsigned_int>(uVar5,b_00);
    uVar6 = (ulong)uVar5 * (ulong)local_40->m_weight + uVar6;
    local_40 = local_40 + 1;
    if (uVar6 < *(ulong *)(in_RDI + 0x25c)) {
      local_44 = local_44 - 1;
    }
    else {
      local_44 = 0;
    }
  }
  if (uVar6 < *(ulong *)(in_RDI + 0x25c)) {
    in_RDI[0x256].field_0 = *in_RSI;
    *(ulong *)(in_RDI + 0x25c) = uVar6;
    in_RDI[0x25e].field_0.field_0.r = '\0';
    in_RDI[0x25e].field_0.field_0.g = bVar1;
    in_RDI[0x25e].field_0.field_0.b =
         *(short *)&in_RDI[0x256].field_0 == *(short *)((long)&in_RDI[0x256].field_0 + 2);
    if ((in_RDI[0x25e].field_0.field_0.b & 1) != 0) {
      if (((uint)in_RDI[0x256].field_0 & 0x1f) == 0x1f) {
        *(short *)((long)&in_RDI[0x256].field_0 + 2) =
             *(short *)((long)&in_RDI[0x256].field_0 + 2) + -1;
        in_RDI[0x25e].field_0.field_0.a = '\0';
      }
      else {
        *(short *)&in_RDI[0x256].field_0 = *(short *)&in_RDI[0x256].field_0 + 1;
        in_RDI[0x25e].field_0.field_0.a = '\x01';
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_uniform(const dxt1_solution_coordinates& coords, bool alternate_rounding) {
  color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
  color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
  color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
  color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
  uint64 error = 0;
  unique_color* color = m_evaluated_colors.get_ptr();
  for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0) {
    uint e01 = math::minimum(color::color_distance(false, color->m_color, c0, false), color::color_distance(false, color->m_color, c1, false));
    uint e23 = math::minimum(color::color_distance(false, color->m_color, c2, false), color::color_distance(false, color->m_color, c3, false));
    error += math::minimum(e01, e23) * (uint64)color->m_weight;
  }
  if (error >= m_best_solution.m_error)
    return false;
  m_best_solution.m_coords = coords;
  m_best_solution.m_error = error;
  m_best_solution.m_alpha_block = false;
  m_best_solution.m_alternate_rounding = alternate_rounding;
  m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
  if (m_best_solution.m_enforce_selector) {
    if ((m_best_solution.m_coords.m_low_color & 31) != 31) {
      m_best_solution.m_coords.m_low_color++;
      m_best_solution.m_enforced_selector = 1;
    } else {
      m_best_solution.m_coords.m_high_color--;
      m_best_solution.m_enforced_selector = 0;
    }
  }
  return true;
}